

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O1

void __thiscall
SudokuChain::outputSpecification
          (SudokuChain *this,
          vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
          *specifications)

{
  SudokuType SVar1;
  pointer psVar2;
  ostream *poVar3;
  int iVar4;
  shared_ptr<SudokuChain::SudokuSpecification> *spec;
  pointer psVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sudoku specification: ",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  psVar5 = (specifications->
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (specifications->
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar2) {
    iVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((psVar5->
                                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->squared_size);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((psVar5->
                                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->squared_size);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      SVar1 = ((psVar5->
               super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->type;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,Sudoku::types_abi_cxx11_[(int)SVar1]._M_dataplus._M_p,
                          Sudoku::types_abi_cxx11_[(int)SVar1]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", offset: (",0xb);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((psVar5->
                                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->offset_from_previous_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((psVar5->
                                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->offset_from_previous_y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"starting index: ",0x10);
      std::ostream::operator<<
                (poVar3,((psVar5->
                         super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->firstOwnIndex);
      if ((((psVar5->
            super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->previous).
          super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," (previous set)",0xf);
      }
      if ((((psVar5->
            super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->next).super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (next set)",0xb);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      iVar4 = iVar4 + 1;
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar2);
  }
  return;
}

Assistant:

void SudokuChain::outputSpecification(std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>> specifications)
{
  std::cout<<"sudoku specification: "<<std::endl;
  int i=0;
  for(auto &spec : specifications)
  {
    std::cout<<"  "<<i<<" "<<spec->squared_size<<"x"<<spec->squared_size
      <<" "<<Sudoku::types[int(spec->type)]
      <<", offset: ("<<spec->offset_from_previous_x<<","<<spec->offset_from_previous_y<<") "
      <<"starting index: "<<spec->firstOwnIndex;
    if(spec->previous)
    {
      std::cout<<" (previous set)";
    }
    if(spec->next)
    {
      std::cout<<" (next set)";
    }
    std::cout<<std::endl;
    i++;
  }
}